

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_provider.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  uchar *in_RCX;
  size_t n;
  size_t n_00;
  uchar *d_00;
  char *d_01;
  string local_f8;
  uchar local_d8 [8];
  Digest d;
  undefined1 local_c0 [8];
  MD5 m;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30 [8];
  string initial;
  
  initial.field_2._12_4_ = 0;
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"potato",&local_51);
  QPDFCryptoProvider::registerImpl<Potato>(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"potato",&local_89);
  QPDFCryptoProvider::setDefaultProvider(&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  QPDFCryptoProvider::getDefaultProvider_abi_cxx11_();
  d_00 = "potato";
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,"potato");
  if (!bVar1) {
    __assert_fail("QPDFCryptoProvider::getDefaultProvider() == \"potato\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/crypto_provider.cc"
                  ,0x59,"int main()");
  }
  std::__cxx11::string::~string
            ((string *)
             &m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  MD5::MD5((MD5 *)local_c0,d_00,n,in_RCX);
  MD5::encodeString((MD5 *)local_c0,"quack");
  MD5::digest((MD5 *)local_c0,local_d8);
  MD5::unparse_abi_cxx11_(&local_f8,(MD5 *)local_c0);
  bVar1 = std::operator==(&local_f8,"30313233343536373839616263646566");
  if (!bVar1) {
    __assert_fail("m.unparse() == \"30313233343536373839616263646566\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/crypto_provider.cc"
                  ,0x5f,"int main()");
  }
  std::__cxx11::string::~string((string *)&local_f8);
  d_01 = "assertions passed\n";
  std::operator<<((ostream *)&std::cout,"assertions passed\n");
  initial.field_2._12_4_ = 0;
  MD5::~MD5((MD5 *)local_c0,(uchar *)d_01,n_00,in_RCX);
  std::__cxx11::string::~string(local_30);
  return initial.field_2._12_4_;
}

Assistant:

int
main()
{
    auto initial = QPDFCryptoProvider::getDefaultProvider();
    QPDFCryptoProvider::registerImpl<Potato>("potato");
    QPDFCryptoProvider::setDefaultProvider("potato");
    assert(QPDFCryptoProvider::getDefaultProvider() == "potato");
    MD5 m;
    m.encodeString("quack"); // anything
    MD5::Digest d;
    m.digest(d);
    // hex for 0123456789abcdef
    assert(m.unparse() == "30313233343536373839616263646566");
    std::cout << "assertions passed\n";
    return 0;
}